

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O0

void __thiscall tst_GenericModel::sortByRole(tst_GenericModel *this)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QVariant local_768;
  QVariant local_748;
  QModelIndex local_728;
  undefined1 local_710 [24];
  QVariant local_6f8;
  uint local_6d8;
  qint32 local_6d4;
  int i;
  qint32 local_6c4;
  qsizetype local_6c0;
  QVariant local_6b8;
  QVariant local_698;
  QModelIndex local_678;
  undefined1 local_660 [24];
  QPersistentModelIndex local_648 [8];
  QPersistentModelIndex fiveIndex;
  undefined1 local_628 [24];
  QPersistentModelIndex local_610 [8];
  QPersistentModelIndex oneIndex;
  QString local_5f0;
  QVariant local_5d8;
  QModelIndex local_5b8;
  undefined1 local_5a0 [24];
  QArrayDataPointer<char16_t> local_588;
  QString local_570;
  QVariant local_558;
  QModelIndex local_538;
  undefined1 local_520 [24];
  QArrayDataPointer<char16_t> local_508;
  QString local_4f0;
  QVariant local_4d8;
  QModelIndex local_4b8;
  undefined1 local_4a0 [24];
  QArrayDataPointer<char16_t> local_488;
  QString local_470;
  QVariant local_458;
  QModelIndex local_438;
  undefined1 local_420 [24];
  QArrayDataPointer<char16_t> local_408;
  QString local_3f0;
  QVariant local_3d8;
  QModelIndex local_3b8;
  undefined1 local_3a0 [24];
  QVariant local_388;
  QModelIndex local_368;
  undefined1 local_350 [24];
  QVariant local_338;
  QModelIndex local_318;
  undefined1 local_300 [24];
  QVariant local_2e8;
  QModelIndex local_2c8;
  undefined1 local_2b0 [24];
  QVariant local_298;
  QModelIndex local_278;
  undefined1 local_260 [24];
  QVariant local_248;
  QModelIndex local_228;
  undefined1 local_210 [24];
  QModelIndex local_1f8;
  QModelIndex local_1e0;
  undefined1 local_1c8 [8];
  QSignalSpy layoutChangedSpy;
  undefined1 local_140 [8];
  QSignalSpy layoutAboutToBeChangedSpy;
  undefined1 local_b0 [8];
  ModelTest probe;
  GenericModel testModel;
  tst_GenericModel *this_local;
  char16_t *str_4;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  char16_t *str_3;
  
  GenericModel::GenericModel((GenericModel *)&probe.field_0x8,(QObject *)0x0);
  ModelTest::ModelTest((ModelTest *)local_b0,(QAbstractItemModel *)&probe.field_0x8,(QObject *)0x0);
  GenericModel::setSortRole((int)&probe + 8);
  QSignalSpy::QSignalSpy
            ((QSignalSpy *)local_140,(QObject *)&probe.field_0x8,"2layoutAboutToBeChanged()");
  bVar2 = QSignalSpy::isValid((QSignalSpy *)local_140);
  bVar3 = QTest::qVerify(bVar2,"layoutAboutToBeChangedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x4a8);
  if ((bVar3 & 1) == 0) {
    layoutChangedSpy._124_4_ = 1;
  }
  else {
    QSignalSpy::QSignalSpy((QSignalSpy *)local_1c8,(QObject *)&probe.field_0x8,"2layoutChanged()");
    bVar2 = QSignalSpy::isValid((QSignalSpy *)local_1c8);
    bVar3 = QTest::qVerify(bVar2,"layoutChangedSpy.isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x4aa);
    if ((bVar3 & 1) == 0) {
      layoutChangedSpy._124_4_ = 1;
    }
    else {
      QModelIndex::QModelIndex(&local_1e0);
      QAbstractItemModel::insertColumn((QAbstractItemModel *)&probe.field_0x8,0,&local_1e0);
      QModelIndex::QModelIndex(&local_1f8);
      GenericModel::insertRows((int)&probe + 8,0,(QModelIndex *)0x5);
      QModelIndex::QModelIndex(&local_228);
      GenericModel::index((int)local_210,(int)&probe + 8,(QModelIndex *)0x0);
      QVariant::QVariant(&local_248,3);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_210,(int)&local_248);
      QVariant::~QVariant(&local_248);
      QModelIndex::QModelIndex(&local_278);
      GenericModel::index((int)local_260,(int)&probe + 8,(QModelIndex *)0x1);
      QVariant::QVariant(&local_298,1);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_260,(int)&local_298);
      QVariant::~QVariant(&local_298);
      QModelIndex::QModelIndex(&local_2c8);
      GenericModel::index((int)local_2b0,(int)&probe + 8,(QModelIndex *)0x2);
      QVariant::QVariant(&local_2e8,4);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_2b0,(int)&local_2e8);
      QVariant::~QVariant(&local_2e8);
      QModelIndex::QModelIndex(&local_318);
      GenericModel::index((int)local_300,(int)&probe + 8,(QModelIndex *)0x3);
      QVariant::QVariant(&local_338,2);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_300,(int)&local_338);
      QVariant::~QVariant(&local_338);
      QModelIndex::QModelIndex(&local_368);
      GenericModel::index((int)local_350,(int)&probe + 8,(QModelIndex *)0x4);
      QVariant::QVariant(&local_388,5);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_350,(int)&local_388);
      QVariant::~QVariant(&local_388);
      QModelIndex::QModelIndex(&local_3b8);
      GenericModel::index((int)local_3a0,(int)&probe + 8,(QModelIndex *)0x0);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_408,(Data *)0x0,L"Charles",7);
      QString::QString(&local_3f0,&local_408);
      QVariant::QVariant(&local_3d8,&local_3f0);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_3a0,(int)&local_3d8);
      QVariant::~QVariant(&local_3d8);
      QString::~QString(&local_3f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_408);
      QModelIndex::QModelIndex(&local_438);
      GenericModel::index((int)local_420,(int)&probe + 8,(QModelIndex *)0x1);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_488,(Data *)0x0,L"Emma",4);
      QString::QString(&local_470,&local_488);
      QVariant::QVariant(&local_458,&local_470);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_420,(int)&local_458);
      QVariant::~QVariant(&local_458);
      QString::~QString(&local_470);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_488);
      QModelIndex::QModelIndex(&local_4b8);
      GenericModel::index((int)local_4a0,(int)&probe + 8,(QModelIndex *)0x2);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_508,(Data *)0x0,L"Bob",3);
      QString::QString(&local_4f0,&local_508);
      QVariant::QVariant(&local_4d8,&local_4f0);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_4a0,(int)&local_4d8);
      QVariant::~QVariant(&local_4d8);
      QString::~QString(&local_4f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_508);
      QModelIndex::QModelIndex(&local_538);
      GenericModel::index((int)local_520,(int)&probe + 8,(QModelIndex *)0x3);
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_588,(Data *)0x0,L"Daniel",6);
      QString::QString(&local_570,&local_588);
      QVariant::QVariant(&local_558,&local_570);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_520,(int)&local_558);
      QVariant::~QVariant(&local_558);
      QString::~QString(&local_570);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_588);
      QModelIndex::QModelIndex(&local_5b8);
      GenericModel::index((int)local_5a0,(int)&probe + 8,(QModelIndex *)0x4);
      QArrayDataPointer<char16_t>::QArrayDataPointer
                ((QArrayDataPointer<char16_t> *)&oneIndex,(Data *)0x0,L"Alice",5);
      QString::QString(&local_5f0,(DataPointer *)&oneIndex);
      QVariant::QVariant(&local_5d8,&local_5f0);
      GenericModel::setData((QModelIndex *)&probe.field_0x8,(QVariant *)local_5a0,(int)&local_5d8);
      QVariant::~QVariant(&local_5d8);
      QString::~QString(&local_5f0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&oneIndex);
      QModelIndex::QModelIndex((QModelIndex *)&fiveIndex);
      GenericModel::index((int)local_628,(int)&probe + 8,(QModelIndex *)0x1);
      QPersistentModelIndex::QPersistentModelIndex(local_610,(QModelIndex *)local_628);
      QModelIndex::QModelIndex(&local_678);
      GenericModel::index((int)local_660,(int)&probe + 8,(QModelIndex *)0x4);
      QPersistentModelIndex::QPersistentModelIndex(local_648,(QModelIndex *)local_660);
      QPersistentModelIndex::data((int)&local_698);
      iVar4 = QVariant::toInt((bool *)&local_698);
      bVar3 = QTest::qCompare(iVar4,1,"oneIndex.data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x4ba);
      QVariant::~QVariant(&local_698);
      if (((bVar3 ^ 0xff) & 1) == 0) {
        QPersistentModelIndex::data((int)&local_6b8);
        iVar4 = QVariant::toInt((bool *)&local_6b8);
        bVar3 = QTest::qCompare(iVar4,5,"fiveIndex.data().toInt()","5",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x4bb);
        QVariant::~QVariant(&local_6b8);
        if (((bVar3 ^ 0xff) & 1) == 0) {
          GenericModel::sort((int)&probe + 8,AscendingOrder);
          local_6c0 = QList<QList<QVariant>_>::count
                                ((QList<QList<QVariant>_> *)&layoutAboutToBeChangedSpy.field_0x8);
          local_6c4 = 1;
          bVar2 = QTest::qCompare<long_long,int>
                            (&local_6c0,&local_6c4,"layoutAboutToBeChangedSpy.count()","1",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x4be);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            _i = QList<QList<QVariant>_>::count
                           ((QList<QList<QVariant>_> *)&layoutChangedSpy.field_0x8);
            local_6d4 = 1;
            bVar2 = QTest::qCompare<long_long,int>
                              ((qint64 *)&i,&local_6d4,"layoutChangedSpy.count()","1",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x4bf);
            if (((bVar2 ^ 0xffU) & 1) == 0) {
              for (local_6d8 = 0; uVar1 = local_6d8, (int)local_6d8 < 5; local_6d8 = local_6d8 + 1)
              {
                QModelIndex::QModelIndex(&local_728);
                GenericModel::index((int)local_710,(int)&probe + 8,(QModelIndex *)(ulong)uVar1);
                GenericModel::data((QModelIndex *)&local_6f8,(int)&probe + 8);
                iVar4 = QVariant::toInt((bool *)&local_6f8);
                bVar3 = QTest::qCompare(iVar4,5 - local_6d8,
                                        "testModel.data(testModel.index(i, 0)).toInt()","5 - i",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x4c1);
                QVariant::~QVariant(&local_6f8);
                if (((bVar3 ^ 0xff) & 1) != 0) {
                  layoutChangedSpy._124_4_ = 1;
                  goto LAB_00125a92;
                }
              }
              QPersistentModelIndex::data((int)&local_748);
              iVar4 = QVariant::toInt((bool *)&local_748);
              bVar3 = QTest::qCompare(iVar4,1,"oneIndex.data().toInt()","1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x4c2);
              QVariant::~QVariant(&local_748);
              if (((bVar3 ^ 0xff) & 1) == 0) {
                QPersistentModelIndex::data((int)&local_768);
                iVar4 = QVariant::toInt((bool *)&local_768);
                bVar3 = QTest::qCompare(iVar4,5,"fiveIndex.data().toInt()","5",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x4c3);
                QVariant::~QVariant(&local_768);
                if (((bVar3 ^ 0xff) & 1) == 0) {
                  iVar4 = QPersistentModelIndex::row();
                  bVar3 = QTest::qCompare(iVar4,4,"oneIndex.row()","4",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x4c4);
                  if ((bVar3 & 1) == 0) {
                    layoutChangedSpy._124_4_ = 1;
                  }
                  else {
                    iVar4 = QPersistentModelIndex::row();
                    bVar3 = QTest::qCompare(iVar4,0,"fiveIndex.row()","0",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x4c5);
                    if ((bVar3 & 1) == 0) {
                      layoutChangedSpy._124_4_ = 1;
                    }
                    else {
                      layoutChangedSpy._124_4_ = 0;
                    }
                  }
                }
                else {
                  layoutChangedSpy._124_4_ = 1;
                }
              }
              else {
                layoutChangedSpy._124_4_ = 1;
              }
            }
            else {
              layoutChangedSpy._124_4_ = 1;
            }
          }
          else {
            layoutChangedSpy._124_4_ = 1;
          }
        }
        else {
          layoutChangedSpy._124_4_ = 1;
        }
      }
      else {
        layoutChangedSpy._124_4_ = 1;
      }
LAB_00125a92:
      QPersistentModelIndex::~QPersistentModelIndex(local_648);
      QPersistentModelIndex::~QPersistentModelIndex(local_610);
    }
    QSignalSpy::~QSignalSpy((QSignalSpy *)local_1c8);
  }
  QSignalSpy::~QSignalSpy((QSignalSpy *)local_140);
  ModelTest::~ModelTest((ModelTest *)local_b0);
  GenericModel::~GenericModel((GenericModel *)&probe.field_0x8);
  return;
}

Assistant:

void tst_GenericModel::sortByRole()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.setSortRole(Qt::UserRole);
    QSignalSpy layoutAboutToBeChangedSpy(&testModel, SIGNAL(layoutAboutToBeChanged()));
    QVERIFY(layoutAboutToBeChangedSpy.isValid());
    QSignalSpy layoutChangedSpy(&testModel, SIGNAL(layoutChanged()));
    QVERIFY(layoutChangedSpy.isValid());

    testModel.insertColumn(0);
    testModel.insertRows(0, 5);
    testModel.setData(testModel.index(0, 0), 3);
    testModel.setData(testModel.index(1, 0), 1);
    testModel.setData(testModel.index(2, 0), 4);
    testModel.setData(testModel.index(3, 0), 2);
    testModel.setData(testModel.index(4, 0), 5);
    testModel.setData(testModel.index(0, 0), QStringLiteral("Charles"), Qt::UserRole);
    testModel.setData(testModel.index(1, 0), QStringLiteral("Emma"), Qt::UserRole);
    testModel.setData(testModel.index(2, 0), QStringLiteral("Bob"), Qt::UserRole);
    testModel.setData(testModel.index(3, 0), QStringLiteral("Daniel"), Qt::UserRole);
    testModel.setData(testModel.index(4, 0), QStringLiteral("Alice"), Qt::UserRole);
    QPersistentModelIndex oneIndex(testModel.index(1, 0));
    QPersistentModelIndex fiveIndex(testModel.index(4, 0));
    QCOMPARE(oneIndex.data().toInt(), 1);
    QCOMPARE(fiveIndex.data().toInt(), 5);

    testModel.sort(0, Qt::AscendingOrder);
    QCOMPARE(layoutAboutToBeChangedSpy.count(), 1);
    QCOMPARE(layoutChangedSpy.count(), 1);
    for (int i = 0; i < 5; ++i)
        QCOMPARE(testModel.data(testModel.index(i, 0)).toInt(), 5 - i);
    QCOMPARE(oneIndex.data().toInt(), 1);
    QCOMPARE(fiveIndex.data().toInt(), 5);
    QCOMPARE(oneIndex.row(), 4);
    QCOMPARE(fiveIndex.row(), 0);
}